

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrittenFontCFF.cpp
# Opt level: O0

unsigned_short __thiscall
WrittenFontCFF::EncodeGlyph(WrittenFontCFF *this,uint inGlyph,ULongVector *inCharacters)

{
  WrittenFontRepresentation *pWVar1;
  byte bVar2;
  bool bVar3;
  size_type sVar4;
  size_type sVar5;
  const_reference pvVar6;
  pointer ppVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>,_bool> pVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_118;
  GlyphEncodingInfo local_100;
  pair<const_unsigned_int,_GlyphEncodingInfo> local_e0;
  _Base_ptr local_b8;
  undefined1 local_b0;
  byte local_a1;
  iterator iStack_a0;
  uchar encoding;
  _Self local_98;
  iterator it;
  GlyphEncodingInfo local_70;
  int local_4c;
  pair<const_unsigned_int,_GlyphEncodingInfo> local_48;
  ULongVector *local_20;
  ULongVector *inCharacters_local;
  WrittenFontCFF *pWStack_10;
  uint inGlyph_local;
  WrittenFontCFF *this_local;
  
  local_20 = inCharacters;
  inCharacters_local._4_4_ = inGlyph;
  pWStack_10 = this;
  sVar4 = std::
          map<unsigned_int,_GlyphEncodingInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>_>
          ::size(&((this->super_AbstractWrittenFont).mANSIRepresentation)->mGlyphIDToEncodedChar);
  if (sVar4 == 0) {
    pWVar1 = (this->super_AbstractWrittenFont).mANSIRepresentation;
    local_4c = 0;
    GlyphEncodingInfo::GlyphEncodingInfo(&local_70,0,0);
    std::pair<const_unsigned_int,_GlyphEncodingInfo>::pair<int,_GlyphEncodingInfo,_true>
              (&local_48,&local_4c,&local_70);
    pVar8 = std::
            map<unsigned_int,_GlyphEncodingInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>_>
            ::insert(&pWVar1->mGlyphIDToEncodedChar,&local_48);
    it._M_node = (_Base_ptr)pVar8.first._M_node;
    std::pair<const_unsigned_int,_GlyphEncodingInfo>::~pair(&local_48);
    GlyphEncodingInfo::~GlyphEncodingInfo(&local_70);
    RemoveFromFreeList(this,'\0');
    this->mAssignedPositions[0] = 0;
    this->mAssignedPositionsAvailable[0] = false;
  }
  local_98._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_GlyphEncodingInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>_>
       ::find(&((this->super_AbstractWrittenFont).mANSIRepresentation)->mGlyphIDToEncodedChar,
              (key_type_conflict4 *)((long)&inCharacters_local + 4));
  iStack_a0 = std::
              map<unsigned_int,_GlyphEncodingInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>_>
              ::end(&((this->super_AbstractWrittenFont).mANSIRepresentation)->mGlyphIDToEncodedChar)
  ;
  bVar3 = std::operator==(&local_98,&stack0xffffffffffffff60);
  if (bVar3) {
    sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
    if (sVar5 == 0) {
      local_a1 = (byte)inCharacters_local._4_4_;
    }
    else {
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(local_20);
      local_a1 = (byte)*pvVar6;
    }
    if ((this->mAssignedPositionsAvailable[local_a1] & 1U) == 0) {
      local_a1 = AllocateFromFreeList(this,inCharacters_local._4_4_);
    }
    else {
      RemoveFromFreeList(this,local_a1);
    }
    bVar2 = local_a1;
    this->mAssignedPositions[local_a1] = inCharacters_local._4_4_;
    this->mAssignedPositionsAvailable[local_a1] = false;
    pWVar1 = (this->super_AbstractWrittenFont).mANSIRepresentation;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_118,local_20);
    GlyphEncodingInfo::GlyphEncodingInfo(&local_100,(ushort)bVar2,&local_118);
    std::pair<const_unsigned_int,_GlyphEncodingInfo>::pair<unsigned_int_&,_GlyphEncodingInfo,_true>
              (&local_e0,(uint *)((long)&inCharacters_local + 4),&local_100);
    pVar8 = std::
            map<unsigned_int,_GlyphEncodingInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>_>
            ::insert(&pWVar1->mGlyphIDToEncodedChar,&local_e0);
    local_b8 = (_Base_ptr)pVar8.first._M_node;
    local_b0 = pVar8.second;
    local_98._M_node = local_b8;
    std::pair<const_unsigned_int,_GlyphEncodingInfo>::~pair(&local_e0);
    GlyphEncodingInfo::~GlyphEncodingInfo(&local_100);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_118);
    this->mAvailablePositionsCount = this->mAvailablePositionsCount + 0xff;
  }
  ppVar7 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>::operator->
                     (&local_98);
  return (ppVar7->second).mEncodedCharacter;
}

Assistant:

unsigned short WrittenFontCFF::EncodeGlyph(unsigned int inGlyph,const ULongVector& inCharacters)
{
	// for the first time, add also 0,0 mapping
	if(mANSIRepresentation->mGlyphIDToEncodedChar.size() == 0)
	{
		mANSIRepresentation->mGlyphIDToEncodedChar.insert(UIntToGlyphEncodingInfoMap::value_type(0,GlyphEncodingInfo(0,0)));
		RemoveFromFreeList(0);
		mAssignedPositions[0] = 0;
		mAssignedPositionsAvailable[0] = false;
	}

	UIntToGlyphEncodingInfoMap::iterator it = mANSIRepresentation->mGlyphIDToEncodedChar.find(inGlyph);

	if(it == mANSIRepresentation->mGlyphIDToEncodedChar.end())
	{
		// as a default position, i'm grabbing the ansi bits. this should display nice charachters, when possible
		unsigned char encoding;
		if(inCharacters.size() > 0)
			encoding = (unsigned char)(inCharacters.back() & 0xff);
		else
			encoding = (unsigned char)(inGlyph & 0xff);
		if(mAssignedPositionsAvailable[encoding])
			RemoveFromFreeList(encoding);
		else
			encoding = AllocateFromFreeList(inGlyph);
		mAssignedPositions[encoding] = inGlyph;
		mAssignedPositionsAvailable[encoding] = false;
		it = mANSIRepresentation->mGlyphIDToEncodedChar.insert(
				UIntToGlyphEncodingInfoMap::value_type(inGlyph,GlyphEncodingInfo(encoding,inCharacters))).first;			
		--mAvailablePositionsCount;
	}
	return it->second.mEncodedCharacter;
}